

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

png_uint_32 png_get_uint_32(png_const_bytep buf)

{
  png_uint_32 uval;
  png_const_bytep buf_local;
  
  return (uint)*buf * 0x1000000 + (uint)buf[1] * 0x10000 + (uint)buf[2] * 0x100 + (uint)buf[3];
}

Assistant:

png_uint_32 (PNGAPI
png_get_uint_32)(png_const_bytep buf)
{
   png_uint_32 uval =
       ((png_uint_32)(*(buf    )) << 24) +
       ((png_uint_32)(*(buf + 1)) << 16) +
       ((png_uint_32)(*(buf + 2)) <<  8) +
       ((png_uint_32)(*(buf + 3))      ) ;

   return uval;
}